

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O2

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *
CfdGetElementsUtxoListByC
          (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr__,bool use_asset)

{
  Txid txid;
  Utxo utxo;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_140;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  Txid local_110;
  value_type local_f0;
  
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&local_f0,"7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
             (allocator *)&local_128);
  cfd::core::Txid::Txid(&local_110,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  memset(&local_f0,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&local_140,&local_110);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)&local_140);
  local_f0.txid._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
  local_f0.txid._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
  local_f0.txid._16_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_f0.txid._24_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  local_f0.vout = 0;
  local_f0.amount = 0x12a05f20;
  if (use_asset) {
    cfd::core::ConfidentialAssetId::GetData((ByteData *)&local_140,&exp_dummy_asset_ca);
    cfd::core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
               (ByteData *)&local_140);
    local_f0.asset[0x20] = local_128._M_impl.super__Vector_impl_data._M_start[0x20];
    local_f0.asset._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
    local_f0.asset._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
    local_f0.asset._16_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_f0.asset._24_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(__return_storage_ptr__,&local_f0);
  cfd::core::Txid::~Txid(&local_110);
  std::__cxx11::string::string
            ((string *)&local_f0,"30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
             (allocator *)&local_128);
  cfd::core::Txid::Txid(&local_110,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  memset(&local_f0,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&local_140,&local_110);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)&local_140);
  local_f0.txid._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
  local_f0.txid._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
  local_f0.txid._16_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_f0.txid._24_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  local_f0.vout = 0;
  local_f0.amount = 0x4a817c8;
  if (use_asset) {
    cfd::core::ConfidentialAssetId::GetData((ByteData *)&local_140,&exp_dummy_asset_ca);
    cfd::core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
               (ByteData *)&local_140);
    local_f0.asset[0x20] = local_128._M_impl.super__Vector_impl_data._M_start[0x20];
    local_f0.asset._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
    local_f0.asset._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
    local_f0.asset._16_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_f0.asset._24_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(__return_storage_ptr__,&local_f0);
  cfd::core::Txid::~Txid(&local_110);
  std::__cxx11::string::string
            ((string *)&local_f0,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
             (allocator *)&local_128);
  cfd::core::Txid::Txid(&local_110,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  memset(&local_f0,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&local_140,&local_110);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)&local_140);
  local_f0.txid._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
  local_f0.txid._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
  local_f0.txid._16_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_f0.txid._24_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  local_f0.vout = 0;
  local_f0.amount = 1250000000;
  if (use_asset) {
    cfd::core::ConfidentialAssetId::GetData((ByteData *)&local_140,&exp_dummy_asset_ca);
    cfd::core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
               (ByteData *)&local_140);
    local_f0.asset[0x20] = local_128._M_impl.super__Vector_impl_data._M_start[0x20];
    local_f0.asset._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
    local_f0.asset._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
    local_f0.asset._16_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_f0.asset._24_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(__return_storage_ptr__,&local_f0);
  cfd::core::Txid::~Txid(&local_110);
  std::__cxx11::string::string
            ((string *)&local_f0,"8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
             (allocator *)&local_128);
  cfd::core::Txid::Txid(&local_110,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  memset(&local_f0,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&local_140,&local_110);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)&local_140);
  local_f0.txid._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
  local_f0.txid._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
  local_f0.txid._16_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_f0.txid._24_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  local_f0.vout = 0;
  local_f0.amount = 0x2540be4;
  if (use_asset) {
    cfd::core::ConfidentialAssetId::GetData((ByteData *)&local_140,&exp_dummy_asset_ca);
    cfd::core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
               (ByteData *)&local_140);
    local_f0.asset[0x20] = local_128._M_impl.super__Vector_impl_data._M_start[0x20];
    local_f0.asset._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
    local_f0.asset._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
    local_f0.asset._16_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_f0.asset._24_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(__return_storage_ptr__,&local_f0);
  cfd::core::Txid::~Txid(&local_110);
  std::__cxx11::string::string
            ((string *)&local_f0,"4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",
             (allocator *)&local_128);
  cfd::core::Txid::Txid(&local_110,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  memset(&local_f0,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&local_140,&local_110);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)&local_140);
  local_f0.txid._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
  local_f0.txid._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
  local_f0.txid._16_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_f0.txid._24_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  local_f0.vout = 0;
  local_f0.amount = 0x9502f90;
  if (use_asset) {
    cfd::core::ConfidentialAssetId::GetData((ByteData *)&local_140,&exp_dummy_asset_ca);
    cfd::core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
               (ByteData *)&local_140);
    local_f0.asset[0x20] = local_128._M_impl.super__Vector_impl_data._M_start[0x20];
    local_f0.asset._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
    local_f0.asset._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
    local_f0.asset._16_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_f0.asset._24_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(__return_storage_ptr__,&local_f0);
  cfd::core::Txid::~Txid(&local_110);
  std::__cxx11::string::string
            ((string *)&local_f0,"b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",
             (allocator *)&local_128);
  cfd::core::Txid::Txid(&local_110,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  memset(&local_f0,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&local_140,&local_110);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)&local_140);
  local_f0.txid._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
  local_f0.txid._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
  local_f0.txid._16_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_f0.txid._24_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  local_f0.vout = 0;
  local_f0.amount = 2500000000;
  if (use_asset) {
    cfd::core::ConfidentialAssetId::GetData((ByteData *)&local_140,&exp_dummy_asset_ca);
    cfd::core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
               (ByteData *)&local_140);
    local_f0.asset[0x20] = local_128._M_impl.super__Vector_impl_data._M_start[0x20];
    local_f0.asset._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
    local_f0.asset._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
    local_f0.asset._16_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_f0.asset._24_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(__return_storage_ptr__,&local_f0);
  cfd::core::Txid::~Txid(&local_110);
  std::__cxx11::string::string
            ((string *)&local_f0,"0000000000000000000000000000000000000000000000000000000000000b01",
             (allocator *)&local_128);
  cfd::core::Txid::Txid(&local_110,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  memset(&local_f0,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&local_140,&local_110);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)&local_140);
  local_f0.txid._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
  local_f0.txid._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
  local_f0.txid._16_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_f0.txid._24_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  local_f0.vout = 0;
  local_f0.amount = 0x19abe00;
  if (use_asset) {
    cfd::core::ConfidentialAssetId::GetData((ByteData *)&local_140,&exp_dummy_asset_cb);
    cfd::core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
               (ByteData *)&local_140);
    local_f0.asset[0x20] = local_128._M_impl.super__Vector_impl_data._M_start[0x20];
    local_f0.asset._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
    local_f0.asset._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
    local_f0.asset._16_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_f0.asset._24_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(__return_storage_ptr__,&local_f0);
  cfd::core::Txid::~Txid(&local_110);
  std::__cxx11::string::string
            ((string *)&local_f0,"0000000000000000000000000000000000000000000000000000000000000b02",
             (allocator *)&local_128);
  cfd::core::Txid::Txid(&local_110,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  memset(&local_f0,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&local_140,&local_110);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)&local_140);
  local_f0.txid._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
  local_f0.txid._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
  local_f0.txid._16_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_f0.txid._24_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  local_f0.vout = 0;
  local_f0.amount = 750000;
  if (use_asset) {
    cfd::core::ConfidentialAssetId::GetData((ByteData *)&local_140,&exp_dummy_asset_cb);
    cfd::core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
               (ByteData *)&local_140);
    local_f0.asset[0x20] = local_128._M_impl.super__Vector_impl_data._M_start[0x20];
    local_f0.asset._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
    local_f0.asset._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
    local_f0.asset._16_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_f0.asset._24_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(__return_storage_ptr__,&local_f0);
  cfd::core::Txid::~Txid(&local_110);
  std::__cxx11::string::string
            ((string *)&local_f0,"0000000000000000000000000000000000000000000000000000000000000b03",
             (allocator *)&local_128);
  cfd::core::Txid::Txid(&local_110,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  memset(&local_f0,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&local_140,&local_110);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)&local_140);
  local_f0.txid._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
  local_f0.txid._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
  local_f0.txid._16_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_f0.txid._24_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  local_f0.vout = 0;
  local_f0.amount = 0x14a61a62;
  if (use_asset) {
    cfd::core::ConfidentialAssetId::GetData((ByteData *)&local_140,&exp_dummy_asset_cb);
    cfd::core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
               (ByteData *)&local_140);
    local_f0.asset[0x20] = local_128._M_impl.super__Vector_impl_data._M_start[0x20];
    local_f0.asset._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
    local_f0.asset._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
    local_f0.asset._16_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_f0.asset._24_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(__return_storage_ptr__,&local_f0);
  cfd::core::Txid::~Txid(&local_110);
  std::__cxx11::string::string
            ((string *)&local_f0,"0000000000000000000000000000000000000000000000000000000000000b04",
             (allocator *)&local_128);
  cfd::core::Txid::Txid(&local_110,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  memset(&local_f0,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&local_140,&local_110);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)&local_140);
  local_f0.txid._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
  local_f0.txid._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
  local_f0.txid._16_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_f0.txid._24_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  local_f0.vout = 0;
  local_f0.amount = 0x119ed3e;
  if (use_asset) {
    cfd::core::ConfidentialAssetId::GetData((ByteData *)&local_140,&exp_dummy_asset_cb);
    cfd::core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
               (ByteData *)&local_140);
    local_f0.asset[0x20] = local_128._M_impl.super__Vector_impl_data._M_start[0x20];
    local_f0.asset._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
    local_f0.asset._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
    local_f0.asset._16_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_f0.asset._24_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(__return_storage_ptr__,&local_f0);
  cfd::core::Txid::~Txid(&local_110);
  std::__cxx11::string::string
            ((string *)&local_f0,"0000000000000000000000000000000000000000000000000000000000000c01",
             (allocator *)&local_128);
  cfd::core::Txid::Txid(&local_110,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  memset(&local_f0,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&local_140,&local_110);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)&local_140);
  local_f0.txid._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
  local_f0.txid._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
  local_f0.txid._16_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_f0.txid._24_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  local_f0.vout = 0;
  local_f0.amount = 0x23e8eb8;
  if (use_asset) {
    cfd::core::ConfidentialAssetId::GetData((ByteData *)&local_140,&exp_dummy_asset_cc);
    cfd::core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
               (ByteData *)&local_140);
    local_f0.asset[0x20] = local_128._M_impl.super__Vector_impl_data._M_start[0x20];
    local_f0.asset._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
    local_f0.asset._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
    local_f0.asset._16_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_f0.asset._24_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(__return_storage_ptr__,&local_f0);
  cfd::core::Txid::~Txid(&local_110);
  std::__cxx11::string::string
            ((string *)&local_f0,"0000000000000000000000000000000000000000000000000000000000000c02",
             (allocator *)&local_128);
  cfd::core::Txid::Txid(&local_110,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  memset(&local_f0,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&local_140,&local_110);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)&local_140);
  local_f0.txid._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
  local_f0.txid._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
  local_f0.txid._16_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_f0.txid._24_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  local_f0.vout = 0;
  local_f0.amount = 0x79252f0;
  if (use_asset) {
    cfd::core::ConfidentialAssetId::GetData((ByteData *)&local_140,&exp_dummy_asset_cc);
    cfd::core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
               (ByteData *)&local_140);
    local_f0.asset[0x20] = local_128._M_impl.super__Vector_impl_data._M_start[0x20];
    local_f0.asset._0_8_ = *(undefined8 *)local_128._M_impl.super__Vector_impl_data._M_start;
    local_f0.asset._8_8_ = *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 8);
    local_f0.asset._16_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x10);
    local_f0.asset._24_8_ =
         *(undefined8 *)(local_128._M_impl.super__Vector_impl_data._M_start + 0x18);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(__return_storage_ptr__,&local_f0);
  cfd::core::Txid::~Txid(&local_110);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Utxo> CfdGetElementsUtxoListByC(bool use_asset) {
  std::vector<Utxo> utxos;
  {
    Txid txid("7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 312500000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_ca.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 78125000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_ca.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 1250000000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_ca.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 39062500;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_ca.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 156250000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_ca.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 2500000000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_ca.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("0000000000000000000000000000000000000000000000000000000000000b01");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 26918400;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_cb.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("0000000000000000000000000000000000000000000000000000000000000b02");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 750000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_cb.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("0000000000000000000000000000000000000000000000000000000000000b03");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 346430050;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_cb.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("0000000000000000000000000000000000000000000000000000000000000b04");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 18476350;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_cb.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("0000000000000000000000000000000000000000000000000000000000000c01");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 37654200;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_cc.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("0000000000000000000000000000000000000000000000000000000000000c02");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 127030000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_cc.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
/*
0:  A,  312500000
1:  A,   78125000
2:  A, 1250000000
3:  A,   39062500
4:  A,  156250000
5:  A, 2500000000
6:  B,   26918400
7:  B,     750000
8:  B,  346430050
9:  B,   18476350
10: C,   37654200
11: C,  127030000
*/
  return utxos;
}